

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O0

void writeimage(void)

{
  int iVar1;
  long local_6a8;
  long naxes [2];
  long naxis;
  char cStack_685;
  int bitpix;
  char cStack_680;
  char cStack_67f;
  char cStack_67e;
  char filename [13];
  unsigned_short *array [200];
  long exposure;
  long nelements;
  long fpixel;
  int local_18;
  int jj;
  int ii;
  int status;
  fitsfile *fptr;
  
  cStack_685 = 'a';
  bitpix._0_1_ = 't';
  bitpix._1_1_ = 'e';
  bitpix._2_1_ = 's';
  bitpix._3_1_ = 't';
  cStack_680 = 'f';
  cStack_67f = 'i';
  cStack_67e = 'l';
  builtin_strncpy(filename,".fit",5);
  naxes[1] = 2;
  local_6a8 = 300;
  naxes[0] = 200;
  filename._5_8_ = malloc(120000);
  for (local_18 = 1; local_18 < naxes[0]; local_18 = local_18 + 1) {
    array[(long)local_18 + -1] = array[(long)(local_18 + -1) + -1] + local_6a8;
  }
  remove(&cStack_685);
  jj = 0;
  iVar1 = ffinit(&ii,&cStack_685,&jj);
  if (iVar1 != 0) {
    printerror(jj);
  }
  iVar1 = ffcrim(_ii,0x14,naxes[1] & 0xffffffff,&local_6a8,&jj);
  if (iVar1 != 0) {
    printerror(jj);
  }
  for (fpixel._4_4_ = 0; fpixel._4_4_ < naxes[0]; fpixel._4_4_ = fpixel._4_4_ + 1) {
    for (local_18 = 0; local_18 < local_6a8; local_18 = local_18 + 1) {
      array[(long)fpixel._4_4_ + -1][local_18] = (short)local_18 + (short)fpixel._4_4_;
    }
  }
  iVar1 = ffppr(_ii,0x14,1,local_6a8 * naxes[0],filename._5_8_,&jj);
  if (iVar1 != 0) {
    printerror(jj);
  }
  free((void *)filename._5_8_);
  array[199] = (unsigned_short *)0x5dc;
  iVar1 = ffuky(_ii,0x29,"EXPOSURE",array + 199,"Total Exposure Time",&jj);
  if (iVar1 != 0) {
    printerror(jj);
  }
  iVar1 = ffclos(_ii,&jj);
  if (iVar1 != 0) {
    printerror(jj);
  }
  return;
}

Assistant:

void writeimage( void )

    /******************************************************/
    /* Create a FITS primary array containing a 2-D image */
    /******************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */
    int status, ii, jj;
    long  fpixel, nelements, exposure;
    unsigned short *array[200];

    /* initialize FITS image parameters */
    char filename[] = "atestfil.fit";             /* name for new FITS file */
    int bitpix   =  USHORT_IMG; /* 16-bit unsigned short pixel values       */
    long naxis    =   2;  /* 2-dimensional image                            */    
    long naxes[2] = { 300, 200 };   /* image is 300 pixels wide by 200 rows */

    /* allocate memory for the whole image */ 
    array[0] = (unsigned short *)malloc( naxes[0] * naxes[1]
                                        * sizeof( unsigned short ) );

    /* initialize pointers to the start of each row of the image */
    for( ii=1; ii<naxes[1]; ii++ )
      array[ii] = array[ii-1] + naxes[0];

    remove(filename);               /* Delete old file if it already exists */

    status = 0;         /* initialize status before calling fitsio routines */

    if (fits_create_file(&fptr, filename, &status)) /* create new FITS file */
         printerror( status );           /* call printerror if error occurs */

    /* write the required keywords for the primary array image.     */
    /* Since bitpix = USHORT_IMG, this will cause cfitsio to create */
    /* a FITS image with BITPIX = 16 (signed short integers) with   */
    /* BSCALE = 1.0 and BZERO = 32768.  This is the convention that */
    /* FITS uses to store unsigned integers.  Note that the BSCALE  */
    /* and BZERO keywords will be automatically written by cfitsio  */
    /* in this case.                                                */

    if ( fits_create_img(fptr,  bitpix, naxis, naxes, &status) )
         printerror( status );          

    /* initialize the values in the image with a linear ramp function */
    for (jj = 0; jj < naxes[1]; jj++)
    {   for (ii = 0; ii < naxes[0]; ii++)
        {
            array[jj][ii] = ii + jj;
        }
    }

    fpixel = 1;                               /* first pixel to write      */
    nelements = naxes[0] * naxes[1];          /* number of pixels to write */

    /* write the array of unsigned integers to the FITS file */
    if ( fits_write_img(fptr, TUSHORT, fpixel, nelements, array[0], &status) )
        printerror( status );
      
    free( array[0] );  /* free previously allocated memory */

    /* write another optional keyword to the header */
    /* Note that the ADDRESS of the value is passed in the routine */
    exposure = 1500;
    if ( fits_update_key(fptr, TLONG, "EXPOSURE", &exposure,
         "Total Exposure Time", &status) )
         printerror( status );           

    if ( fits_close_file(fptr, &status) )                /* close the file */
         printerror( status );           

    return;
}